

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFormatTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::CompressedCubeFormatCase::init
          (CompressedCubeFormatCase *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *context;
  ContextInfo *contextInfo;
  deUint32 dVar1;
  int extraout_EAX;
  reference pvVar2;
  TextureCube *this_00;
  TexDecompressionParams local_68;
  int local_64;
  void *pvStack_60;
  int i;
  deUint8 *data;
  int local_50;
  int dataSize;
  int face;
  Random rnd;
  allocator<tcu::CompressedTexture> local_29;
  undefined1 local_28 [8];
  vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_> levels;
  CompressedCubeFormatCase *this_local;
  
  levels.super__Vector_base<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<tcu::CompressedTexture>::allocator(&local_29);
  std::vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>::vector
            ((vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_> *)local_28,6,
             &local_29);
  std::allocator<tcu::CompressedTexture>::~allocator(&local_29);
  de::Random::Random((Random *)&dataSize,this->m_randomSeed);
  for (local_50 = 0; local_50 < 6; local_50 = local_50 + 1) {
    pvVar2 = std::vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>::
             operator[]((vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_> *)
                        local_28,(long)local_50);
    tcu::CompressedTexture::setStorage(pvVar2,this->m_format,this->m_width,this->m_height,1);
    pvVar2 = std::vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>::
             operator[]((vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_> *)
                        local_28,(long)local_50);
    data._4_4_ = tcu::CompressedTexture::getDataSize(pvVar2);
    pvVar2 = std::vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>::
             operator[]((vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_> *)
                        local_28,(long)local_50);
    pvStack_60 = tcu::CompressedTexture::getData(pvVar2);
    for (local_64 = 0; local_64 < data._4_4_; local_64 = local_64 + 1) {
      dVar1 = de::Random::getUint32((Random *)&dataSize);
      *(char *)((long)pvStack_60 + (long)local_64) = (char)dVar1;
    }
  }
  this_00 = (TextureCube *)operator_new(0x180);
  context = this->m_renderCtx;
  contextInfo = this->m_renderCtxInfo;
  pvVar2 = std::vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>::operator[]
                     ((vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_> *)
                      local_28,0);
  tcu::TexDecompressionParams::TexDecompressionParams(&local_68,ASTCMODE_LAST);
  glu::TextureCube::TextureCube(this_00,context,contextInfo,1,pvVar2,&local_68);
  this->m_texture = this_00;
  this->m_curFace = 0;
  this->m_isOk = true;
  de::Random::~Random((Random *)&dataSize);
  std::vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>::~vector
            ((vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_> *)local_28);
  return extraout_EAX;
}

Assistant:

void CompressedCubeFormatCase::init (void)
{
	vector<tcu::CompressedTexture>	levels	(tcu::CUBEFACE_LAST);
	de::Random						rnd		(m_randomSeed);

	for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
	{
		levels[face].setStorage(m_format, m_width, m_height);

		int			dataSize	= levels[face].getDataSize();
		deUint8*	data		= (deUint8*)levels[face].getData();

		for (int i = 0; i < dataSize; i++)
			data[i] = rnd.getUint32() & 0xff;
	}

	m_texture = new glu::TextureCube(m_renderCtx, m_renderCtxInfo, 1, &levels[0]);

	m_curFace	= 0;
	m_isOk		= true;
}